

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O1

void Cmd_slot(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *__nptr;
  
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    __nptr = FCommandLine::operator[](argv,1);
    iVar1 = atoi(__nptr);
    if (iVar1 < 10) {
      SendItemUse = (AInventory *)
                    FWeaponSlot::PickWeapon
                              ((((player_t *)(&players + (long)consoleplayer * 0x54))->weapons).
                               Slots + iVar1,(player_t *)(&players + (long)consoleplayer * 0x54),
                               ((uint)dmflags2.Value >> 0x18 & 1) == 0);
    }
  }
  return;
}

Assistant:

CCMD (slot)
{
	if (argv.argc() > 1)
	{
		int slot = atoi (argv[1]);

		if (slot < NUM_WEAPON_SLOTS)
		{
			SendItemUse = players[consoleplayer].weapons.Slots[slot].PickWeapon (&players[consoleplayer], 
				!(dmflags2 & DF2_DONTCHECKAMMO));
		}
	}
}